

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  char *s_00;
  long lVar3;
  long lVar4;
  uint64_t uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  pair<unsigned_long,_unsigned_long> pVar23;
  pair<unsigned_long,_unsigned_long> pVar24;
  
  if (len < 0x41) {
    uVar5 = farmhashna::Hash64WithSeeds(s,len,seed0,seed1);
    return uVar5;
  }
  uVar9 = (ulong)((uint)(len - 1) & 0x3f);
  plVar6 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
  s_00 = (char *)((uVar9 - 0x3f) + (long)plVar6);
  if (s + (len - 0x40) == s_00) {
    uVar15 = 0;
    lVar22 = seed0 * -0x651e95c4d06fbfb1;
    lVar14 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar17 = (ulong)(lVar14 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar14 * -0x651e95c4d06fbfb1;
    uVar18 = uVar17 * -0x651e95c4d06fbfb1;
    lVar11 = seed0 + uVar17 * 0x651e95c4d06fbfb1;
    lVar7 = (ulong)((uint)lVar11 & 0x82) + 0x9ae16a3b2f90404f;
    lVar8 = 0;
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar3 = *(long *)((long)s + 0x30);
      lVar4 = *(long *)((long)s + 8);
      lVar21 = uVar15 + *(long *)((long)s + 0x38);
      uVar15 = lVar14 + *(long *)((long)s + 0x10);
      uVar17 = (uVar18 + *plVar1) * lVar7;
      uVar18 = lVar22 + *(long *)s + lVar4;
      lVar14 = lVar11 + *(long *)((long)s + 0x38);
      uVar18 = (uVar18 >> 0x1a | uVar18 << 0x26) * 9;
      lVar22 = uVar18 + lVar4;
      lVar19 = (uVar17 >> 0x20 | uVar17 << 0x20) + lVar21;
      lVar11 = *(long *)s + lVar3 + lVar19 * 9;
      uVar17 = seed0 + *(long *)((long)s + 0x20);
      lVar8 = (lVar8 + lVar3 ^ uVar18) * 9 + *(long *)((long)s + 0x20);
      uVar18 = uVar15 >> 0x1d | uVar15 << 0x23;
      lVar10 = (uVar17 >> 0x21 | uVar17 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar2 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      lVar14 = lVar14 + lVar10;
      lVar16 = lVar22 - lVar14;
      seed0 = lVar10 + lVar16;
      uVar17 = seed1 + lVar4 + *plVar2;
      uVar15 = lVar3 + *plVar2 + lVar21 + lVar19 + lVar16;
      seed1 = (uVar17 >> 0x1e | uVar17 << 0x22) + *plVar1 + lVar8;
      lVar8 = lVar8 + seed1;
      lVar22 = lVar22 + uVar15;
      uVar15 = uVar15 >> 0x22 | uVar15 * 0x40000000;
    } while ((long *)s != plVar6);
    uVar13 = seed0 >> 0x14 | seed0 << 0x2c;
    uVar12 = seed1 >> 0x1c | seed1 << 0x24;
    lVar11 = lVar11 * 9 + lVar14;
    uVar17 = lVar14 + lVar11;
    uVar18 = uVar18 + lVar8 + uVar9;
    uVar20 = uVar18 >> 0x21 | uVar18 * 0x80000000;
    uVar18 = (uVar13 - lVar22) + uVar17 + *(long *)((long)plVar6 + (uVar9 - 0x37));
    uVar17 = *(ulong *)((long)plVar6 + (uVar9 - 0xf)) ^ uVar12 ^ uVar17;
    uVar18 = uVar15 * 9 ^ (uVar18 >> 0x25 | uVar18 * 0x8000000) * lVar7;
    uVar17 = uVar13 + *(long *)((long)plVar6 + (uVar9 - 0x17)) +
             (uVar17 >> 0x2a | uVar17 << 0x16) * lVar7;
    lVar14 = uVar20 * lVar7;
    pVar23 = farmhashna::WeakHashLen32WithSeeds(s_00,uVar12 * lVar7,lVar8 + uVar9 + uVar18);
    pVar24 = farmhashna::WeakHashLen32WithSeeds
                       ((char *)((long)plVar6 + (uVar9 - 0x1f)),uVar15 + lVar14,
                        *(long *)((long)plVar6 + (uVar9 - 0x2f)) + uVar17);
    uVar12 = lVar14 + pVar24.second;
    uVar9 = pVar24.first ^ uVar17;
    uVar15 = (pVar23.first + uVar18 ^ uVar9) * lVar7;
    uVar17 = (pVar23.second + uVar17 ^ uVar12) * -0x651e95c4d06fbfb1;
    uVar17 = uVar17 >> 0x2f ^ uVar12 ^ uVar17;
    uVar9 = (uVar9 ^ uVar15 ^ uVar15 >> 0x2f) * lVar7;
    uVar18 = (uVar17 * -0x41befec400000000 | uVar17 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar18;
    uVar9 = (((uVar9 ^ uVar9 >> 0x2f) + uVar20) * lVar7 - lVar11 ^ uVar18) * -0x651e95c4d06fbfb1;
    uVar9 = uVar9 >> 0x2f ^ uVar18 ^ uVar9;
    return (uVar9 * 0x5f20809e00000000 | uVar9 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1;
  }
  __assert_fail("s + len - 64 == last64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                ,0x271,
                "uint64_t farmhashuo::Hash64WithSeeds(const char *, size_t, uint64_t, uint64_t)");
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}